

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

bool __thiscall
slang::ast::GenericClassDefSymbol::SpecializationKey::operator==
          (SpecializationKey *this,SpecializationKey *other)

{
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_00;
  Type *rhs_00;
  bool bVar1;
  bool bVar2;
  pointer ppCVar3;
  size_type sVar4;
  size_type sVar5;
  pointer ppTVar6;
  pointer ppCVar7;
  pointer ppTVar8;
  pointer ppCVar9;
  pointer ppTVar10;
  
  if ((((this->savedHash == other->savedHash) && (this->definition == other->definition)) &&
      (sVar5 = (this->paramValues).size_, sVar5 == (other->paramValues).size_)) &&
     (sVar4 = (this->typeParams).size_, sVar4 == (other->typeParams).size_)) {
    if (sVar5 != 0) {
      ppCVar9 = (other->paramValues).data_;
      ppCVar3 = (this->paramValues).data_;
      ppCVar7 = ppCVar3;
      do {
        lhs = *ppCVar7;
        rhs = *ppCVar9;
        if (rhs == (ConstantValue *)0x0 || lhs == (ConstantValue *)0x0) {
          if (lhs != rhs) goto LAB_003d5ebc;
        }
        else {
          bVar1 = slang::operator==(lhs,rhs);
          if (!bVar1) goto LAB_003d5ebc;
          ppCVar3 = (this->paramValues).data_;
          sVar5 = (this->paramValues).size_;
        }
        ppCVar7 = ppCVar7 + 1;
        ppCVar9 = ppCVar9 + 1;
      } while (ppCVar7 != ppCVar3 + sVar5);
      sVar4 = (this->typeParams).size_;
    }
    bVar1 = true;
    if (sVar4 != 0) {
      ppTVar8 = (other->typeParams).data_;
      ppTVar6 = (this->typeParams).data_;
      ppTVar10 = ppTVar6;
      do {
        this_00 = *ppTVar10;
        rhs_00 = *ppTVar8;
        if (rhs_00 == (Type *)0x0 || this_00 == (Type *)0x0) {
          if (this_00 != rhs_00) goto LAB_003d5ebc;
        }
        else {
          bVar2 = Type::isMatching(this_00,rhs_00);
          if (!bVar2) goto LAB_003d5ebc;
          ppTVar6 = (this->typeParams).data_;
          sVar4 = (this->typeParams).size_;
        }
        ppTVar10 = ppTVar10 + 1;
        ppTVar8 = ppTVar8 + 1;
      } while (ppTVar10 != ppTVar6 + sVar4);
    }
  }
  else {
LAB_003d5ebc:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GenericClassDefSymbol::SpecializationKey::operator==(const SpecializationKey& other) const {
    if (savedHash != other.savedHash || definition != other.definition ||
        paramValues.size() != other.paramValues.size() ||
        typeParams.size() != other.typeParams.size()) {
        return false;
    }

    for (auto lit = paramValues.begin(), rit = other.paramValues.begin(); lit != paramValues.end();
         lit++, rit++) {
        const ConstantValue* l = *lit;
        const ConstantValue* r = *rit;
        if (l && r) {
            if (!(*l == *r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    for (auto lit = typeParams.begin(), rit = other.typeParams.begin(); lit != typeParams.end();
         lit++, rit++) {
        const Type* l = *lit;
        const Type* r = *rit;
        if (l && r) {
            if (!l->isMatching(*r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    return true;
}